

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_ostream.hpp
# Opt level: O0

ostream_base * __thiscall
pstore::exchange::export_ns::ostream_base::write<5l>(ostream_base *this,span<const_char,_5L> s)

{
  pointer peVar1;
  index_type value;
  unsigned_long *puVar2;
  long value_00;
  pointer peVar3;
  char *pcVar4;
  span_iterator<pstore::gsl::span<const_char,__1L>,_false> local_68;
  span_iterator<pstore::gsl::span<const_char,__1L>,_false> local_58;
  undefined1 local_48 [8];
  span<const_char,__1L> ss;
  unsigned_long count;
  size_t available;
  unsigned_long remaining;
  index_type index;
  ostream_base *this_local;
  span<const_char,_5L> s_local;
  
  remaining = 0;
  index = (index_type)this;
  this_local = (ostream_base *)s.storage_.data_;
  value = gsl::span<const_char,_5L>::size((span<const_char,_5L> *)&this_local);
  available = unsigned_cast<long,unsigned_long,void>(value);
  while( true ) {
    if (available == 0) {
      return this;
    }
    count = available_space(this);
    if (count == 0) {
      count = flush(this);
    }
    if (count == 0) {
      assert_failed("available > 0U",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/exchange/export_ostream.hpp"
                    ,0x9c);
    }
    puVar2 = std::min<unsigned_long>(&available,&count);
    peVar1 = (pointer)*puVar2;
    ss.storage_.data_ = peVar1;
    value_00 = std::numeric_limits<long>::max();
    peVar3 = (pointer)unsigned_cast<long,unsigned_long,void>(value_00);
    if (peVar3 < peVar1) {
      assert_failed("count <= unsigned_cast (std::numeric_limits<span_index_type>::max ())",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/exchange/export_ostream.hpp"
                    ,0xa2);
    }
    _local_48 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
                gsl::span<const_char,_5L>::subspan
                          ((span<const_char,_5L> *)&this_local,remaining,
                           (index_type)ss.storage_.data_);
    gsl::span<const_char,_-1L>::begin((span<const_char,__1L> *)&local_58);
    gsl::span<const_char,_-1L>::end((span<const_char,__1L> *)&local_68);
    pcVar4 = std::
             copy<pstore::gsl::details::span_iterator<pstore::gsl::span<char_const,_1l>,false>,char*>
                       (&local_58,&local_68,this->ptr_);
    this->ptr_ = pcVar4;
    if (this->end_ < this->ptr_) break;
    available = available - (long)ss.storage_.data_;
    remaining = (unsigned_long)(ss.storage_.data_ + remaining);
  }
  assert_failed("ptr_ <= end_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/exchange/export_ostream.hpp"
                ,0xa5);
}

Assistant:

ostream_base & ostream_base::write (gsl::span<char const, Extent> const s) {
                if (s.empty ()) {
                    return *this;
                }
                auto index = typename gsl::span<char const, Extent>::index_type{0};
                auto remaining = unsigned_cast (s.size ());
                while (remaining > 0U) {
                    // Flush the buffer if it is full.
                    auto available = this->available_space ();
                    if (available == 0U) {
                        available = this->flush ();
                    }
                    PSTORE_ASSERT (available > 0U);

                    // Copy as many characters as we can from the input span to the buffer.
                    auto const count = std::min (remaining, available);
                    using span_index_type = gsl::span<char const>::index_type;
                    PSTORE_ASSERT (count <=
                                   unsigned_cast (std::numeric_limits<span_index_type>::max ()));
                    auto ss = s.subspan (index, static_cast<span_index_type> (count));
                    ptr_ = std::copy (ss.begin (), ss.end (), ptr_);
                    PSTORE_ASSERT (ptr_ <= end_);

                    // Adjust our view of the characters remaining to be copied.
                    remaining -= count;
                    index += count;
                }
                return *this;
            }